

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
DnsStats::SubmitRegistryNumberAndCount
          (DnsStats *this,uint32_t registry_id,uint32_t number,uint64_t count)

{
  bool stored;
  DnsHashEntry local_68;
  
  local_68.HashNext = (DnsHashEntry *)0x0;
  stored = false;
  local_68._8_8_ = (ulong)registry_id << 0x20;
  local_68.key_type = 0;
  local_68.key_length = 4;
  local_68.count = count;
  local_68.field_6.key_number = number;
  BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_68,true,&stored);
  return;
}

Assistant:

void DnsStats::SubmitRegistryNumberAndCount(uint32_t registry_id, uint32_t number, uint64_t count)
{
    DnsHashEntry key;
    bool stored = false;

    key.count = count;
    key.registry_id = registry_id;
    key.key_length = sizeof(uint32_t);
    key.key_type = 0; /* number */
    key.key_number = number;

    (void)hashTable.InsertOrAdd(&key, true, &stored);
}